

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int agent_connect_unix(LIBSSH2_AGENT *agent)

{
  int iVar1;
  undefined1 local_8e [8];
  sockaddr_un s_un;
  char *path;
  LIBSSH2_AGENT *agent_local;
  
  s_un.sun_path._100_8_ = agent->identity_agent_path;
  if (((char *)s_un.sun_path._100_8_ == (char *)0x0) &&
     (s_un.sun_path._100_8_ = getenv("SSH_AUTH_SOCK"), (char *)s_un.sun_path._100_8_ == (char *)0x0)
     ) {
    agent_local._4_4_ = _libssh2_error(agent->session,-0x27,"no auth sock variable");
  }
  else {
    iVar1 = socket(1,1,0);
    agent->fd = iVar1;
    if (agent->fd < 0) {
      agent_local._4_4_ = _libssh2_error(agent->session,-0x2d,"failed creating socket");
    }
    else {
      local_8e._0_2_ = 1;
      strncpy(local_8e + 2,(char *)s_un.sun_path._100_8_,0x6c);
      s_un.sun_path[99] = '\0';
      iVar1 = connect(agent->fd,(sockaddr *)local_8e,0x6e);
      if (iVar1 == 0) {
        agent_local._4_4_ = 0;
      }
      else {
        close(agent->fd);
        agent_local._4_4_ = _libssh2_error(agent->session,-0x2a,"failed connecting with agent");
      }
    }
  }
  return agent_local._4_4_;
}

Assistant:

static int
agent_connect_unix(LIBSSH2_AGENT *agent)
{
    const char *path;
    struct sockaddr_un s_un;

    path = agent->identity_agent_path;
    if(!path) {
        path = getenv("SSH_AUTH_SOCK");
        if(!path)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                                  "no auth sock variable");
    }

    agent->fd = socket(PF_UNIX, SOCK_STREAM, 0);
    if(agent->fd < 0)
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_SOCKET,
                              "failed creating socket");

    s_un.sun_family = AF_UNIX;
    strncpy(s_un.sun_path, path, sizeof(s_un.sun_path));
    s_un.sun_path[sizeof(s_un.sun_path)-1] = 0; /* make sure there's a trailing
                                                   zero */
    if(connect(agent->fd, (struct sockaddr*)(&s_un), sizeof(s_un)) != 0) {
        close(agent->fd);
        return _libssh2_error(agent->session, LIBSSH2_ERROR_AGENT_PROTOCOL,
                              "failed connecting with agent");
    }

    return LIBSSH2_ERROR_NONE;
}